

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

void __thiscall
google::protobuf::io::CodedOutputStream::WriteVarint32(CodedOutputStream *this,uint32 value)

{
  byte *pbVar1;
  bool bVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  uint32 uVar6;
  uint8 bytes [5];
  byte local_5 [5];
  
  if (4 < this->buffer_size_) {
    pbVar1 = this->buffer_;
    *pbVar1 = (byte)value | 0x80;
    if (value < 0x80) {
      *pbVar1 = (byte)value;
      lVar3 = 1;
    }
    else {
      bVar4 = (byte)(value >> 7);
      pbVar1[1] = bVar4 | 0x80;
      if (value < 0x4000) {
        pbVar1[1] = bVar4;
        lVar3 = 2;
      }
      else {
        bVar4 = (byte)(value >> 0xe);
        pbVar1[2] = bVar4 | 0x80;
        if (value < 0x200000) {
          pbVar1[2] = bVar4;
          lVar3 = 3;
        }
        else {
          bVar4 = (byte)(value >> 0x15);
          pbVar1[3] = bVar4 | 0x80;
          if (value < 0x10000000) {
            pbVar1[3] = bVar4;
            lVar3 = 4;
          }
          else {
            pbVar1[4] = (byte)(value >> 0x1c);
            lVar3 = 5;
          }
        }
      }
    }
    this->buffer_ = this->buffer_ + lVar3;
    this->buffer_size_ = this->buffer_size_ - (int)lVar3;
    return;
  }
  uVar5 = 0;
  if (0x7f < value) {
    uVar5 = 0;
    uVar6 = value;
    do {
      local_5[uVar5] = (byte)uVar6 | 0x80;
      uVar5 = uVar5 + 1;
      value = uVar6 >> 7;
      bVar2 = 0x3fff < uVar6;
      uVar6 = value;
    } while (bVar2);
  }
  local_5[uVar5 & 0xffffffff] = (byte)value;
  WriteRaw(this,local_5,(int)uVar5 + 1);
  return;
}

Assistant:

void CodedOutputStream::WriteVarint32(uint32 value) {
  if (buffer_size_ >= kMaxVarint32Bytes) {
    // Fast path:  We have enough bytes left in the buffer to guarantee that
    // this write won't cross the end, so we can skip the checks.
    uint8* target = buffer_;
    uint8* end = WriteVarint32FallbackToArrayInline(value, target);
    int size = end - target;
    Advance(size);
  } else {
    // Slow path:  This write might cross the end of the buffer, so we
    // compose the bytes first then use WriteRaw().
    uint8 bytes[kMaxVarint32Bytes];
    int size = 0;
    while (value > 0x7F) {
      bytes[size++] = (static_cast<uint8>(value) & 0x7F) | 0x80;
      value >>= 7;
    }
    bytes[size++] = static_cast<uint8>(value) & 0x7F;
    WriteRaw(bytes, size);
  }
}